

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O1

SW_FT_Long SW_FT_MulFix(SW_FT_Long a,SW_FT_Long b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = (uint)(a >> 0x3f) | 1;
  uVar1 = -uVar2;
  if (-1 < b) {
    uVar1 = uVar2;
  }
  lVar6 = b * a;
  lVar4 = -lVar6;
  if (0 < lVar6) {
    lVar4 = lVar6;
  }
  uVar5 = lVar4 + 0x8000U >> 0x10;
  uVar3 = -uVar5;
  if (0 < (int)uVar1) {
    uVar3 = uVar5;
  }
  return uVar3;
}

Assistant:

SW_FT_Long SW_FT_MulFix(SW_FT_Long a, SW_FT_Long b)
{
    SW_FT_Int  s = 1;
    SW_FT_Long c;

    SW_FT_MOVE_SIGN(a, s);
    SW_FT_MOVE_SIGN(b, s);

    c = (SW_FT_Long)(((SW_FT_Int64)a * b + 0x8000L) >> 16);

    return (s > 0) ? c : -c;
}